

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

lua_Integer luaV_div(lua_State *L,lua_Integer m,lua_Integer n)

{
  if (1 < n + 1U) {
    if (-1 < (n ^ m)) {
      return m / n;
    }
    return m / n + -1 + (ulong)(m % n == 0);
  }
  if (n != 0) {
    return -m;
  }
  luaG_runerror(L,"attempt to divide by zero");
}

Assistant:

lua_Integer luaV_div (lua_State *L, lua_Integer m, lua_Integer n) {
  if (l_castS2U(n) + 1u <= 1u) {  /* special cases: -1 or 0 */
    if (n == 0)
      luaG_runerror(L, "attempt to divide by zero");
    return intop(-, 0, m);   /* n==-1; avoid overflow with 0x80000...//-1 */
  }
  else {
    lua_Integer q = m / n;  /* perform C division */
    if ((m ^ n) < 0 && m % n != 0)  /* 'm/n' would be negative non-integer? */
      q -= 1;  /* correct result for different rounding */
    return q;
  }
}